

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  uchar *puVar1;
  uchar *puVar2;
  byte bVar3;
  ushort uVar4;
  int *piVar5;
  int *piVar6;
  unsigned_short *puVar7;
  int *piVar8;
  uint uVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uchar *puVar20;
  size_t sVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uchar *puVar25;
  int iVar26;
  uint uVar27;
  uchar *puVar28;
  uint uVar29;
  ulong uVar30;
  size_t left;
  ulong uVar31;
  size_t left_1;
  ulong uVar32;
  uchar *puVar33;
  ulong uVar34;
  bool bVar35;
  uint local_cc;
  
  uVar12 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar12 = windowsize;
  }
  uVar19 = 0x40;
  if (0x1fff < windowsize) {
    uVar19 = 0x102;
  }
  uVar23 = 0x3c;
  if (0xffff7fff < windowsize - 0x8001) {
    uVar16 = windowsize - 1;
    uVar23 = 0x5a;
    if ((windowsize & uVar16) == 0) {
      uVar23 = 0x102;
      if (nicematch < 0x102) {
        uVar23 = nicematch;
      }
      if (inpos < insize) {
        uVar11 = 0;
        uVar9 = 0;
        bVar10 = false;
        uVar22 = 0;
        puVar1 = in + insize;
        do {
          uVar13 = getHash(in,insize,inpos);
          uVar30 = 0;
          if (uVar13 == 0) {
            if (uVar22 == 0) {
              puVar2 = in + inpos;
              puVar25 = puVar2;
              puVar20 = puVar2;
              puVar33 = in + inpos + 0x102;
              if (puVar1 < in + inpos + 0x102) {
                puVar33 = puVar1;
              }
              for (; (puVar25 != puVar33 && (puVar20 = puVar25, *puVar25 == '\0'));
                  puVar25 = puVar25 + 1) {
                puVar20 = puVar33;
              }
              uVar30 = (ulong)(uint)((int)puVar20 - (int)puVar2);
            }
            else {
              if ((insize < uVar22 + inpos) || (in[(uVar22 + inpos) - 1] != '\0')) {
                uVar22 = uVar22 - 1;
              }
              uVar30 = (ulong)uVar22;
            }
          }
          uVar22 = (uint)uVar30;
          piVar5 = hash->val;
          uVar24 = (uint)inpos & uVar16;
          uVar15 = (ulong)uVar24;
          piVar5[uVar15] = uVar13;
          piVar6 = hash->head;
          if (piVar6[uVar13] != -1) {
            hash->chain[uVar15] = (unsigned_short)piVar6[uVar13];
          }
          piVar6[uVar13] = uVar24;
          puVar7 = hash->zeros;
          puVar7[uVar15] = (unsigned_short)uVar30;
          piVar8 = hash->headz;
          if (piVar8[uVar30 & 0xffff] != -1) {
            hash->chainz[uVar15] = (unsigned_short)piVar8[uVar30 & 0xffff];
          }
          piVar8[uVar30 & 0xffff] = uVar24;
          uVar31 = inpos + 0x102;
          if (insize <= inpos + 0x102) {
            uVar31 = insize;
          }
          if (uVar12 == 0) {
            local_cc = 0;
            uVar24 = 0;
          }
          else {
            uVar24 = 0;
            local_cc = 0;
            puVar2 = in + uVar31;
            puVar25 = in + inpos;
            uVar17 = 0;
            uVar18 = (ulong)hash->chain[uVar15];
            uVar14 = 1;
            do {
              uVar32 = 0;
              if (uVar15 < uVar18) {
                uVar32 = (ulong)windowsize;
              }
              uVar32 = uVar32 + (uVar15 - uVar18);
              uVar29 = (uint)uVar32;
              if (uVar29 < (uint)uVar17) break;
              if (uVar32 != 0) {
                puVar33 = in + (inpos - (uVar32 & 0xffffffff));
                puVar20 = puVar25;
                if (2 < uVar22) {
                  uVar17 = (ulong)(uint)puVar7[uVar18];
                  if (uVar22 < puVar7[uVar18]) {
                    uVar17 = uVar30;
                  }
                  puVar33 = puVar33 + uVar17;
                  puVar20 = puVar25 + uVar17;
                }
                iVar26 = (int)puVar2;
                if (puVar20 != puVar2) {
                  do {
                    puVar28 = puVar20;
                    if (*puVar33 != *puVar20) break;
                    puVar33 = puVar33 + 1;
                    puVar20 = puVar20 + 1;
                    puVar28 = in + uVar31;
                  } while (puVar20 != puVar2);
                  iVar26 = (int)puVar28;
                }
                uVar27 = iVar26 - (int)puVar25;
                if ((uVar24 < uVar27) && (uVar24 = uVar27, local_cc = uVar29, uVar23 <= uVar27))
                break;
              }
              uVar4 = hash->chain[uVar18];
              uVar34 = (ulong)uVar4;
              if ((ushort)uVar18 == uVar4) break;
              if ((uVar22 < 3) || (uVar24 <= uVar22)) {
                if (piVar5[uVar4] != uVar13) break;
              }
              else {
                uVar34 = (ulong)hash->chainz[uVar18];
                if (uVar22 != puVar7[uVar34]) break;
              }
              bVar35 = uVar14 != uVar12;
              uVar17 = uVar32;
              uVar18 = uVar34;
              uVar14 = uVar14 + 1;
            } while (bVar35);
          }
          bVar35 = bVar10;
          if (lazymatching == 0) {
LAB_0031079d:
            if ((2 < uVar24) && (windowsize < local_cc)) {
              return 0x56;
            }
            bVar10 = bVar35;
            if (((uVar24 < 3) || (uVar24 < minmatch)) || ((uVar24 == 3 && (0x1000 < local_cc)))) {
              bVar3 = in[inpos];
              uVar13 = uivector_resize(out,out->size + 1);
              if (uVar13 == 0) {
                return 0x53;
              }
              out->data[out->size - 1] = (uint)bVar3;
            }
            else {
              uVar15 = 0x1c;
              uVar31 = 1;
              do {
                uVar17 = uVar15 + uVar31 >> 1;
                if (LENGTHBASE[uVar17] < uVar24) {
                  uVar31 = uVar17 + 1;
                }
                else {
                  uVar15 = uVar17 - 1;
                }
              } while (uVar31 <= uVar15);
              if ((0x1c < uVar31) || (uVar24 < LENGTHBASE[uVar31])) {
                uVar31 = uVar31 - 1;
              }
              uVar22 = LENGTHBASE[uVar31 & 0xffffffff];
              uVar15 = 0x1d;
              uVar17 = 1;
              do {
                uVar18 = uVar15 + uVar17 >> 1;
                if (DISTANCEBASE[uVar18] < local_cc) {
                  uVar17 = uVar18 + 1;
                }
                else {
                  uVar15 = uVar18 - 1;
                }
              } while (uVar17 <= uVar15);
              if ((0x1d < uVar17) || (local_cc < DISTANCEBASE[uVar17])) {
                uVar17 = uVar17 - 1;
              }
              uVar13 = DISTANCEBASE[uVar17 & 0xffffffff];
              uVar14 = uivector_resize(out,out->size + 1);
              sVar21 = out->size;
              if (uVar14 != 0) {
                out->data[sVar21 - 1] = (int)uVar31 + 0x101;
              }
              uVar14 = uivector_resize(out,sVar21 + 1);
              sVar21 = out->size;
              if (uVar14 != 0) {
                out->data[sVar21 - 1] = uVar24 - uVar22;
              }
              uVar22 = uivector_resize(out,sVar21 + 1);
              sVar21 = out->size;
              if (uVar22 != 0) {
                out->data[sVar21 - 1] = (uint)uVar17;
              }
              uVar22 = uivector_resize(out,sVar21 + 1);
              if (uVar22 != 0) {
                out->data[out->size - 1] = local_cc - uVar13;
              }
              uVar13 = 1;
              piVar5 = hash->val;
              puVar7 = hash->zeros;
              piVar6 = hash->head;
              piVar8 = hash->headz;
              sVar21 = inpos;
              do {
                inpos = sVar21 + 1;
                uVar22 = getHash(in,insize,inpos);
                uVar15 = 0;
                if (uVar22 == 0) {
                  if ((int)uVar30 == 0) {
                    puVar2 = in + inpos;
                    puVar25 = puVar2;
                    puVar20 = puVar2;
                    puVar33 = in + sVar21 + 0x103;
                    if (puVar1 < in + sVar21 + 0x103) {
                      puVar33 = puVar1;
                    }
                    for (; (puVar25 != puVar33 && (puVar20 = puVar25, *puVar25 == '\0'));
                        puVar25 = puVar25 + 1) {
                      puVar20 = puVar33;
                    }
                    uVar15 = (ulong)(uint)((int)puVar20 - (int)puVar2);
                  }
                  else if ((insize < inpos + uVar30) ||
                          (uVar15 = uVar30, in[uVar30 + sVar21] != '\0')) {
                    uVar15 = (ulong)((int)uVar30 - 1);
                  }
                }
                uVar14 = (uint)inpos & uVar16;
                piVar5[uVar14] = uVar22;
                iVar26 = piVar6[uVar22];
                if (iVar26 != -1) {
                  hash->chain[uVar14] = (unsigned_short)iVar26;
                }
                piVar6[uVar22] = uVar14;
                puVar7[uVar14] = (unsigned_short)uVar15;
                iVar26 = piVar8[uVar15 & 0xffff];
                if (iVar26 != -1) {
                  hash->chainz[uVar14] = (unsigned_short)iVar26;
                }
                uVar13 = uVar13 + 1;
                piVar8[uVar15 & 0xffff] = uVar14;
                uVar22 = (uint)uVar15;
                sVar21 = inpos;
                uVar30 = uVar15;
              } while (uVar13 != uVar24);
            }
          }
          else {
            if ((bVar10) || (uVar24 < 3)) {
              bVar35 = false;
              if (bVar10) {
                if (inpos == 0) {
                  return 0x51;
                }
                if (uVar9 + 1 < uVar24) {
                  bVar3 = in[inpos - 1];
                  uVar13 = uivector_resize(out,out->size + 1);
                  if (uVar13 == 0) {
                    return 0x53;
                  }
                  out->data[out->size - 1] = (uint)bVar3;
                  bVar35 = false;
                }
                else {
                  inpos = inpos - 1;
                  piVar6[uVar13] = -1;
                  piVar8[uVar30] = -1;
                  uVar24 = uVar9;
                  local_cc = uVar11;
                  bVar35 = false;
                }
              }
              goto LAB_0031079d;
            }
            bVar35 = false;
            if (uVar19 < uVar24 || 0x101 < uVar24) goto LAB_0031079d;
            uVar9 = uVar24;
            bVar10 = true;
            uVar11 = local_cc;
          }
          inpos = inpos + 1;
        } while (inpos < insize);
      }
      uVar23 = 0;
    }
  }
  return uVar23;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching)
{
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos)
  {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0)
    {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    }
    else
    {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;)
    {
      if(chainlength++ >= maxchainlength) break;
      current_offset = hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize;

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0)
      {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3)
        {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/
        {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length)
        {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros)
      {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      }
      else
      {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching)
    {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH)
      {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy)
      {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1)
        {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        }
        else
        {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/
    {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else if(length < minmatch || (length == 3 && offset > 4096))
    {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else
    {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i)
      {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0)
        {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        }
        else
        {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}